

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

MQTT_DEVICE_TWIN_ITEM *
createDeviceTwinMsg(MQTTTRANSPORT_HANDLE_DATA *transport_data,
                   DEVICE_TWIN_MSG_TYPE device_twin_msg_type,uint32_t iothub_msg_id)

{
  uint16_t uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  tickcounter_ms_t current_time;
  MQTT_DEVICE_TWIN_ITEM *result;
  uint32_t iothub_msg_id_local;
  DEVICE_TWIN_MSG_TYPE device_twin_msg_type_local;
  MQTTTRANSPORT_HANDLE_DATA *transport_data_local;
  
  result._0_4_ = iothub_msg_id;
  result._4_4_ = device_twin_msg_type;
  _iothub_msg_id_local = transport_data;
  iVar2 = tickcounter_get_current_ms(transport_data->msgTickCounter,(tickcounter_ms_t *)&l);
  if (iVar2 == 0) {
    current_time = (tickcounter_ms_t)malloc(0x50);
    if ((void *)current_time == (void *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"createDeviceTwinMsg",0x477,1,"Failed allocating device twin data.");
      }
      current_time = 0;
    }
    else {
      memset((void *)current_time,0,0x50);
      *(LOGGER_LOG *)current_time = l;
      uVar1 = getNextPacketId(_iothub_msg_id_local);
      *(uint16_t *)(current_time + 0x18) = uVar1;
      *(uint32_t *)(current_time + 0x1c) = (uint32_t)result;
      *(DEVICE_TWIN_MSG_TYPE *)(current_time + 0x28) = result._4_4_;
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"createDeviceTwinMsg",0x472,1,"Failed retrieving tickcounter info");
    }
    current_time = 0;
  }
  return (MQTT_DEVICE_TWIN_ITEM *)current_time;
}

Assistant:

static MQTT_DEVICE_TWIN_ITEM* createDeviceTwinMsg(MQTTTRANSPORT_HANDLE_DATA* transport_data, DEVICE_TWIN_MSG_TYPE device_twin_msg_type, uint32_t iothub_msg_id)
{
    MQTT_DEVICE_TWIN_ITEM* result;
    tickcounter_ms_t current_time;

    if (tickcounter_get_current_ms(transport_data->msgTickCounter, &current_time) != 0)
    {
        LogError("Failed retrieving tickcounter info");
        result = NULL;
    }
    else if ((result = (MQTT_DEVICE_TWIN_ITEM*)malloc(sizeof(MQTT_DEVICE_TWIN_ITEM))) == NULL)
    {
        LogError("Failed allocating device twin data.");
        result = NULL;
    }
    else
    {
        memset(result, 0, sizeof(*result));
        result->msgCreationTime = current_time;
        result->packet_id = getNextPacketId(transport_data);
        result->iothub_msg_id = iothub_msg_id;
        result->device_twin_msg_type = device_twin_msg_type;
    }

    return result;
}